

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::CompactRange(DBImpl *this,Slice *begin,Slice *end)

{
  bool bVar1;
  Slice *in_RDI;
  int level_1;
  int level;
  Version *base;
  MutexLock l;
  int max_level_with_files;
  Slice *in_stack_00000078;
  Slice *in_stack_00000080;
  int in_stack_0000008c;
  DBImpl *in_stack_00000090;
  Slice *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffbc;
  int iVar2;
  Version *in_stack_ffffffffffffffc0;
  int local_34;
  DBImpl *in_stack_ffffffffffffffd8;
  int local_1c;
  
  local_1c = 1;
  MutexLock::MutexLock((MutexLock *)in_RDI,(Mutex *)in_stack_ffffffffffffffa8);
  VersionSet::current((VersionSet *)in_RDI[0xa2].data_);
  for (local_34 = 1; local_34 < 7; local_34 = local_34 + 1) {
    bVar1 = Version::OverlapInLevel
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_RDI,
                       in_stack_ffffffffffffffa8);
    if (bVar1) {
      local_1c = local_34;
    }
  }
  MutexLock::~MutexLock((MutexLock *)0x11082a);
  TEST_CompactMemTable(in_stack_ffffffffffffffd8);
  Status::~Status((Status *)in_RDI);
  for (iVar2 = 0; iVar2 < local_1c; iVar2 = iVar2 + 1) {
    TEST_CompactRange(in_stack_00000090,in_stack_0000008c,in_stack_00000080,in_stack_00000078);
  }
  return;
}

Assistant:

void DBImpl::CompactRange(const Slice* begin, const Slice* end) {
  int max_level_with_files = 1;
  {
    MutexLock l(&mutex_);
    Version* base = versions_->current();
    for (int level = 1; level < config::kNumLevels; level++) {
      if (base->OverlapInLevel(level, begin, end)) {
        max_level_with_files = level;
      }
    }
  }
  TEST_CompactMemTable();  // TODO(sanjay): Skip if memtable does not overlap
  for (int level = 0; level < max_level_with_files; level++) {
    TEST_CompactRange(level, begin, end);
  }
}